

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

void __thiscall SSD1306::OledI2C::displayUpdate(OledI2C *this)

{
  int __v;
  byte bVar1;
  ssize_t sVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  long lVar4;
  byte bVar5;
  byte bVar6;
  array<SSD1306::OledI2C::PixelBlock,_32UL> *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string what;
  
  __buf = &this->blocks_;
  lVar4 = 0x440;
  bVar5 = 0;
  bVar1 = 0;
  do {
    if (lVar4 == 0) {
      return;
    }
    if (__buf->_M_elems[0].dirty_ == true) {
      sendCommand(this,bVar1 | 0xb0);
      sendCommand(this,'\0');
      sendCommand(this,bVar5 >> 4 | 0x10);
      sVar2 = write((this->fd_).fd_,__buf,0x21);
      if (sVar2 == -1) {
        std::__cxx11::to_string(&local_70,0x15a);
        std::operator+(&local_90,
                       "write /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                       ,&local_70);
        std::operator+(&what,&local_90,")");
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar3 = __errno_location();
        __v = *piVar3;
        __ecat = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,__v,__ecat,&what);
        __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      __buf->_M_elems[0].dirty_ = false;
    }
    bVar6 = bVar5 + 0x20;
    bVar5 = bVar6;
    if ((char)bVar6 < '\x01') {
      bVar5 = 0;
    }
    bVar1 = bVar1 - ((char)bVar6 >> 7);
    lVar4 = lVar4 + -0x22;
    __buf = (array<SSD1306::OledI2C::PixelBlock,_32UL> *)(__buf->_M_elems + 1);
  } while( true );
}

Assistant:

void
SSD1306::OledI2C::displayUpdate()
{
    uint8_t page{0};
    uint8_t column{0};

    for (auto& block : blocks_)
    {
        if (block.dirty_)
        {
            uint8_t column_low = column & 0xF;
            uint8_t column_high = (column >> 4) & 0x0F;

            sendCommand(OLED_SET_PAGE_START_ADDRESS_MASK | page);
            sendCommand(OLED_SET_COLUMN_START_LOW_MASK | column_low);
            sendCommand(OLED_SET_COLUMN_START_HIGH_MASK | column_high);

            if (::write(fd_.fd(),
                        block.bytes_.data(),
                        block.bytes_.size()) == -1)
            {
                std::string what( "write " __FILE__ "("
                                + std::to_string(__LINE__)
                                + ")" );
                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }

            block.dirty_ = false;
        }

        column += OledI2C::ColumnsPerBlock;

        if (column >= Width)
        {
            column = 0;
            page += 1;
        }
    }
}